

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.h
# Opt level: O2

void __thiscall HDD::~HDD(HDD *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~HDD() { Unlock(); if (h != -1) close(h); Reset(); }